

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  size_t local_28;
  size_t max_local;
  char *second_local;
  char *first_local;
  
  local_28 = max;
  max_local = (size_t)second;
  second_local = first;
  while( true ) {
    bVar3 = false;
    if ((*second_local != '\0') && (bVar3 = false, *(char *)max_local != '\0')) {
      bVar3 = local_28 != 0;
    }
    if (!bVar3) break;
    cVar1 = raw_toupper(*second_local);
    cVar2 = raw_toupper(*(char *)max_local);
    if (cVar1 != cVar2) break;
    local_28 = local_28 - 1;
    second_local = second_local + 1;
    max_local = max_local + 1;
  }
  if (local_28 == 0) {
    first_local._4_4_ = 1;
  }
  else {
    cVar1 = raw_toupper(*second_local);
    cVar2 = raw_toupper(*(char *)max_local);
    first_local._4_4_ = (uint)(cVar1 == cVar2);
  }
  return first_local._4_4_;
}

Assistant:

int strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(raw_toupper(*first) != raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return raw_toupper(*first) == raw_toupper(*second);
}